

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegratorCreator.hpp
# Opt level: O0

Integrator * __thiscall
OpenMD::IntegratorBuilder<OpenMD::NPTxyz>::create
          (IntegratorBuilder<OpenMD::NPTxyz> *this,SimInfo *info)

{
  SimInfo *info_00;
  NPTxyz *in_stack_ffffffffffffffe0;
  
  info_00 = (SimInfo *)operator_new(0x328);
  NPTxyz::NPTxyz(in_stack_ffffffffffffffe0,info_00);
  return (Integrator *)info_00;
}

Assistant:

virtual Integrator* create(SimInfo* info) const {
      return new ConcreteIntegrator(info);
    }